

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O0

XrResult ApiDumpLayerXrCreateSpatialAnchorAsyncBD
                   (XrSenseDataProviderBD provider,XrSpatialAnchorCreateInfoBD *info,
                   XrFutureEXT *future)

{
  undefined8 gen_dispatch_table_00;
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  invalid_argument *this;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408 [32];
  ostringstream local_3e8 [8];
  ostringstream oss_future;
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220 [32];
  ostringstream local_200 [8];
  ostringstream oss_provider;
  _Node_iterator_base<std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>,_false>
  local_80;
  _Node_iterator_base<std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>,_false>
  local_78;
  iterator map_iter;
  undefined1 local_60 [8];
  unique_lock<std::mutex> mlock;
  XrGeneratedDispatchTable *gen_dispatch_table;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  XrResult result;
  XrFutureEXT *future_local;
  XrSpatialAnchorCreateInfoBD *info_local;
  XrSenseDataProviderBD provider_local;
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  info_local = (XrSpatialAnchorCreateInfoBD *)provider;
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&gen_dispatch_table);
  mlock._M_owns = false;
  mlock._9_7_ = 0;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_60,&g_sensedataproviderbd_dispatch_mutex);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<XrSenseDataProviderBD_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSenseDataProviderBD_T_*>,_std::equal_to<XrSenseDataProviderBD_T_*>,_std::allocator<std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::find(&g_sensedataproviderbd_dispatch_map,(key_type *)&info_local);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<XrSenseDataProviderBD_T_*,_XrGeneratedDispatchTable_*,_std::hash<XrSenseDataProviderBD_T_*>,_std::equal_to<XrSenseDataProviderBD_T_*>,_std::allocator<std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>_>_>
       ::end(&g_sensedataproviderbd_dispatch_map);
  bVar1 = std::__detail::operator==(&local_78,&local_80);
  if (bVar1) {
    provider_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
             ::operator->((_Node_iterator<std::pair<XrSenseDataProviderBD_T_*const,_XrGeneratedDispatchTable_*>,_false,_false>
                           *)&local_78);
    mlock._8_8_ = ppVar2->second;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_60);
  if (!bVar1) {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[29],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [9])"XrResult",
               (char (*) [29])"xrCreateSpatialAnchorAsyncBD",(char (*) [1])0x2ffb54);
    std::__cxx11::ostringstream::ostringstream(local_200);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_200,std::hex);
    std::ostream::operator<<(poVar3,info_local);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[22],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [22])"XrSenseDataProviderBD",
               (char (*) [9])"provider",local_220);
    std::__cxx11::string::~string((string *)local_220);
    gen_dispatch_table_00 = mlock._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"info",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"const XrSpatialAnchorCreateInfoBD*",&local_269);
    bVar1 = ApiDumpOutputXrStruct
                      ((XrGeneratedDispatchTable *)gen_dispatch_table_00,info,(string *)local_240,
                       (string *)local_268,true,
                       (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&gen_dispatch_table);
    std::__cxx11::string::~string(local_268);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::ostringstream::ostringstream(local_3e8);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_3e8,std::hex);
    std::ostream::operator<<(poVar3,future);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[13],char_const(&)[7],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&gen_dispatch_table,(char (*) [13])"XrFutureEXT*",(char (*) [7])"future",local_408
              );
    std::__cxx11::string::~string((string *)local_408);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_420,
             (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&gen_dispatch_table);
    ApiDumpLayerRecordContent(&local_420);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_420);
    contents.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (**(code **)(mlock._8_8_ + 0x928))(info_local,info,future);
    std::__cxx11::ostringstream::~ostringstream(local_3e8);
    std::__cxx11::ostringstream::~ostringstream(local_200);
    bVar1 = false;
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&gen_dispatch_table);
  if (bVar1 == false) {
    provider_local._4_4_ =
         contents.
         super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return provider_local._4_4_;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrCreateSpatialAnchorAsyncBD(
    XrSenseDataProviderBD provider,
    const XrSpatialAnchorCreateInfoBD* info,
    XrFutureEXT* future) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_sensedataproviderbd_dispatch_mutex);
            auto map_iter = g_sensedataproviderbd_dispatch_map.find(provider);
            if (map_iter == g_sensedataproviderbd_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrCreateSpatialAnchorAsyncBD", "");
        std::ostringstream oss_provider;
        oss_provider << std::hex << reinterpret_cast<const void*>(provider);
        contents.emplace_back("XrSenseDataProviderBD", "provider", oss_provider.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, info, "info", "const XrSpatialAnchorCreateInfoBD*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_future;
        oss_future << std::hex << reinterpret_cast<const void*>(future);
        contents.emplace_back("XrFutureEXT*", "future", oss_future.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->CreateSpatialAnchorAsyncBD(provider, info, future);
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}